

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O2

void __thiscall
CP::priority_queue<int,_std::less<int>_>::fixDown
          (priority_queue<int,_std::less<int>_> *this,size_t idx)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  
  piVar4 = this->mData;
  uVar5 = this->mSize;
  iVar3 = piVar4[idx];
  while (uVar2 = idx * 2 + 1, uVar2 < uVar5) {
    uVar1 = idx * 2 + 2;
    uVar6 = uVar2;
    if ((uVar1 < uVar5) && (uVar6 = uVar1, piVar4[idx * 2 + 2] <= piVar4[uVar2])) {
      uVar6 = uVar2;
    }
    if (piVar4[uVar6] < iVar3) break;
    piVar4[idx] = piVar4[uVar6];
    idx = uVar6;
  }
  piVar4[idx] = iVar3;
  return;
}

Assistant:

void fixDown(size_t idx) {
      T tmp = mData[idx];
      size_t c;
      while ((c = 2 * idx + 1) < mSize) {
        if (c + 1 < mSize && mLess(mData[c],mData[c + 1]) ) c++;
        if ( mLess(mData[c],tmp) ) break;
        mData[idx] = mData[c];
        idx = c;
      }
      mData[idx] = tmp;
    }